

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::_::ExceptionOr<kj::_::Void>_>::dispose(Array<kj::_::ExceptionOr<kj::_::Void>_> *this)

{
  ExceptionOr<kj::_::Void> *pEVar1;
  size_t sVar2;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (ExceptionOr<kj::_::Void> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (ExceptionOr<kj::_::Void> *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pEVar1,0x168,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::_::ExceptionOr<kj::_::Void>,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }